

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubroutineSymbols.cpp
# Opt level: O0

Statement * __thiscall slang::ast::SubroutineSymbol::getBody(SubroutineSymbol *this)

{
  LookupLocation lookupLocation;
  bool bVar1;
  Statement *pSVar2;
  FunctionDeclarationSyntax *this_00;
  bitmask<slang::ast::ASTFlags> in_RDI;
  StatementContext *in_stack_00000008;
  ASTContext *in_stack_00000010;
  SyntaxList<slang::syntax::SyntaxNode> *in_stack_00000018;
  StatementContext stmtCtx;
  ASTContext context;
  ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source_ast_symbols_SubroutineSymbols_cpp:46:37)>
  guard;
  SyntaxNode *syntax;
  ASTContext *in_stack_ffffffffffffff18;
  Scope *in_stack_ffffffffffffff20;
  Symbol *this_01;
  Scope *in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  Compilation *in_stack_ffffffffffffff50;
  StatementContext *in_stack_ffffffffffffff60;
  bitmask<slang::ast::ASTFlags> local_98 [3];
  bitmask<slang::ast::ASTFlags> local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  bitmask<slang::ast::ASTFlags> abStack_58 [5];
  anon_class_8_1_8991fb9c_for_func local_30;
  ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source_ast_symbols_SubroutineSymbols_cpp:46:37)>
  local_28;
  SyntaxNode *local_18;
  undefined1 *local_8;
  
  if (*(long *)&((Symbol *)(in_RDI.m_bits + 0xc0))->indexInScope == 0) {
    local_18 = Symbol::getSyntax((Symbol *)in_RDI.m_bits);
    if ((local_18 == (SyntaxNode *)0x0) ||
       (bVar1 = slang::syntax::FunctionDeclarationSyntax::isKind(local_18->kind), !bVar1)) {
      Scope::getCompilation((Scope *)(in_RDI.m_bits + 0x40));
      pSVar2 = StatementList::makeEmpty(in_stack_ffffffffffffff50);
      *(Statement **)&((Symbol *)(in_RDI.m_bits + 0xc0))->indexInScope = pSVar2;
    }
    else {
      if (((((Symbol *)(in_RDI.m_bits + 0x100))->location).field_0x2 & 1) != 0) {
        local_8 = InvalidStatement::Instance;
        return (Statement *)local_8;
      }
      (((Symbol *)(in_RDI.m_bits + 0x100))->location).field_0x2 = 1;
      ScopeGuard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/ast/symbols/SubroutineSymbols.cpp:46:37)>
      ::ScopeGuard(&local_28,&local_30);
      this_01 = (Symbol *)(in_RDI.m_bits + 0x40);
      local_78 = LookupLocation::max;
      uStack_70 = DAT_01a3c808;
      bitmask<slang::ast::ASTFlags>::bitmask(&local_80,None);
      lookupLocation._8_8_ = in_stack_ffffffffffffff40;
      lookupLocation.scope = in_stack_ffffffffffffff38;
      ASTContext::ASTContext((ASTContext *)this_01,in_stack_ffffffffffffff20,lookupLocation,in_RDI);
      if (*(int *)((long)&((Symbol *)(in_RDI.m_bits + 0x80))->originatingSyntax + 4) == 0) {
        bitmask<slang::ast::ASTFlags>::bitmask(local_98,Function);
        bitmask<slang::ast::ASTFlags>::operator|=(abStack_58,local_98);
      }
      Statement::StatementContext::StatementContext
                ((StatementContext *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      this_00 = slang::syntax::SyntaxNode::as<slang::syntax::FunctionDeclarationSyntax>(local_18);
      pSVar2 = Statement::bindItems(in_stack_00000018,in_stack_00000010,in_stack_00000008);
      *(Statement **)&((Symbol *)(in_RDI.m_bits + 0xc0))->indexInScope = pSVar2;
      Statement::StatementContext::~StatementContext(in_stack_ffffffffffffff60);
      ScopeGuard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/ast/symbols/SubroutineSymbols.cpp:46:37)>
      ::~ScopeGuard((ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source_ast_symbols_SubroutineSymbols_cpp:46:37)>
                     *)this_00);
    }
  }
  return *(Statement **)&((Symbol *)(in_RDI.m_bits + 0xc0))->indexInScope;
}

Assistant:

const Statement& SubroutineSymbol::getBody() const {
    if (!stmt) {
        auto syntax = getSyntax();
        if (!syntax || !FunctionDeclarationSyntax::isKind(syntax->kind)) {
            // DPI functions, subroutines created from prototypes, etc
            // don't have a real body.
            stmt = &StatementList::makeEmpty(getCompilation());
        }
        else if (isConstructing) {
            // Avoid issues with recursive function calls re-entering this
            // method while we're still constructing.
            return InvalidStatement::Instance;
        }
        else {
            isConstructing = true;
            auto guard = ScopeGuard([this] { isConstructing = false; });

            ASTContext context(*this, LookupLocation::max);
            if (subroutineKind == SubroutineKind::Function)
                context.flags |= ASTFlags::Function;

            Statement::StatementContext stmtCtx(context);
            stmtCtx.blocks = blocks;

            stmt = &Statement::bindItems(syntax->as<FunctionDeclarationSyntax>().items, context,
                                         stmtCtx);
        }
    }
    return *stmt;
}